

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesFrequencyOcGetMode(zes_freq_handle_t hFrequency,zes_oc_mode_t *pCurrentOcMode)

{
  zes_pfnFrequencyOcGetMode_t pfnOcGetMode;
  ze_result_t result;
  zes_oc_mode_t *pCurrentOcMode_local;
  zes_freq_handle_t hFrequency_local;
  
  pfnOcGetMode._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cc70 != (code *)0x0) {
    pfnOcGetMode._4_4_ = (*DAT_0011cc70)(hFrequency,pCurrentOcMode);
  }
  return pfnOcGetMode._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFrequencyOcGetMode(
        zes_freq_handle_t hFrequency,                   ///< [in] Handle for the component.
        zes_oc_mode_t* pCurrentOcMode                   ///< [out] Current Overclocking Mode ::zes_oc_mode_t.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnOcGetMode = context.zesDdiTable.Frequency.pfnOcGetMode;
        if( nullptr != pfnOcGetMode )
        {
            result = pfnOcGetMode( hFrequency, pCurrentOcMode );
        }
        else
        {
            // generic implementation
        }

        return result;
    }